

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

bool Catch::anon_unknown_1::almostEqualUlps<float>(float lhs,float rhs,uint64_t maxUlpDiff)

{
  ulong uVar1;
  uint uVar2;
  int32_t iVar3;
  int32_t iVar4;
  int in_EDI;
  undefined4 in_register_0000003c;
  float in_XMM0_Da;
  float extraout_XMM0_Da;
  float in_XMM1_Da;
  float ulpDiff;
  int32_t rc;
  int32_t lc;
  
  uVar1 = CONCAT44(in_register_0000003c,in_EDI);
  uVar2 = isnan((double)(ulong)(uint)in_XMM0_Da);
  if (((uVar2 & 1) == 0) && (uVar2 = isnan((double)(ulong)(uint)in_XMM1_Da), (uVar2 & 1) == 0)) {
    iVar3 = convert(in_XMM0_Da);
    iVar4 = convert(in_XMM1_Da);
    if (iVar3 < 0 != iVar4 < 0) {
      return in_XMM0_Da == in_XMM1_Da;
    }
    clara::std::abs(in_EDI);
    return (ulong)((long)extraout_XMM0_Da |
                  (long)(extraout_XMM0_Da - 9.223372e+18) & (long)extraout_XMM0_Da >> 0x3f) <= uVar1
    ;
  }
  return false;
}

Assistant:

bool almostEqualUlps(FP lhs, FP rhs, uint64_t maxUlpDiff) {
        // Comparison with NaN should always be false.
        // This way we can rule it out before getting into the ugly details
        if (Catch::isnan(lhs) || Catch::isnan(rhs)) {
            return false;
        }

        auto lc = convert(lhs);
        auto rc = convert(rhs);

        if ((lc < 0) != (rc < 0)) {
            // Potentially we can have +0 and -0
            return lhs == rhs;
        }

        // static cast as a workaround for IBM XLC
        auto ulpDiff = std::abs(static_cast<FP>(lc - rc));
        return static_cast<uint64_t>(ulpDiff) <= maxUlpDiff;
    }